

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O3

char * lex_token(LexerContext *lexer,char *begin,char *end,size_t begin_pos)

{
  byte bVar1;
  char *pcVar2;
  unsigned_long uVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  pair<const_char_*,_unsigned_long> *ppVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Token type;
  bool bVar11;
  bool bVar12;
  undefined1 local_48 [24];
  
  if (begin == end) {
    return end;
  }
  lVar10 = 0;
  while( true ) {
    bVar1 = begin[lVar10];
    uVar5 = (ulong)bVar1;
    if (0x2c < uVar5) break;
    if ((0x130100002200U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0x22) {
        local_48[0] = true;
        pcVar6 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (begin + lVar10 + 1,end);
        local_48._8_8_ = lVar10 + begin_pos;
        if (pcVar6 == end) {
          lexer->any_error = true;
          local_48._0_8_ = &lexer->stream;
          local_48._16_8_ = lVar10 + begin_pos + 1;
          ProgramContext::error<TokenStream::TokenInfo>
                    (lexer->program,(TokenInfo *)local_48,"missing terminating \'\"\' character");
          return end;
        }
        LexerContext::add_token
                  (lexer,String,local_48._8_8_,(size_t)(pcVar6 + (-lVar10 - (long)begin) + 1));
        return pcVar6 + 1;
      }
      break;
    }
    lVar4 = lVar10 + 1;
    lVar10 = lVar10 + 1;
    if (begin + lVar4 == end) {
      return end;
    }
  }
  pcVar6 = (char *)(lVar10 + begin_pos);
  if (9 < (byte)(bVar1 - 0x30) && 1 < (byte)(bVar1 - 0x2d)) {
LAB_00193a5c:
    lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_48,begin + lVar10,end);
    ppVar7 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value
                       ((optional<std::pair<const_char_*,_size_t>_> *)local_48);
    pcVar2 = ppVar7->first;
    uVar3 = ppVar7->second;
    LexerContext::add_token
              (lexer,Text,(size_t)pcVar6,(size_t)(pcVar2 + uVar3 + (-lVar10 - (long)begin)));
    return pcVar2 + uVar3;
  }
  lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_48,begin + lVar10,end);
  ppVar7 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value
                     ((optional<std::pair<const_char_*,_size_t>_> *)local_48);
  pcVar2 = ppVar7->first;
  uVar5 = ppVar7->second;
  if ((uVar5 < 3) || (*pcVar2 != '0')) {
    bVar12 = false;
    uVar8 = 0;
  }
  else {
    bVar12 = (pcVar2[1] & 0xdfU) == 0x58;
    uVar8 = (ulong)((uint)bVar12 * 2);
  }
  if (uVar8 < uVar5) {
    bVar11 = false;
    do {
      uVar9 = uVar8 + 1;
      bVar1 = pcVar2[uVar8];
      if (((byte)(bVar1 - 0x3a) < 0xf6) &&
         (((!bVar12 || ((5 < (byte)(bVar1 + 0xbf) && (5 < bVar1 - 0x61)))) && (bVar1 != 0x2d))))
      break;
      bVar11 = uVar5 <= uVar9;
      uVar8 = uVar9;
    } while (uVar9 != uVar5);
    if (!bVar11) {
      bVar12 = false;
      uVar8 = 1;
      do {
        bVar1 = pcVar2[uVar8 - 1];
        if (((9 < (byte)(bVar1 - 0x30) && bVar1 != 0x2e) && (uVar8 != 1 || bVar1 != 0x2d)) &&
           ((bVar1 | 0x20) != 0x66)) break;
        bVar12 = uVar5 <= uVar8;
        bVar11 = uVar8 != uVar5;
        uVar8 = uVar8 + 1;
      } while (bVar11);
      if (!bVar12) goto LAB_00193a5c;
      type = Float;
      goto LAB_0019399e;
    }
    if (((2 < uVar5) && ((lexer->program->opt).pedantic != false)) &&
       ((*pcVar2 == '0' && ((pcVar2[1] & 0xdfU) == 0x58)))) {
      local_48._0_8_ = &lexer->stream;
      local_48._16_8_ = begin_pos + uVar5 + lVar10;
      local_48._8_8_ = pcVar6;
      ProgramContext::pedantic<TokenStream::TokenInfo>
                (lexer->program,(TokenInfo *)local_48,
                 "hexadecimal integer literals are a language extension [-pedantic]");
    }
  }
  type = Integer;
LAB_0019399e:
  LexerContext::add_token(lexer,type,(size_t)pcVar6,uVar5);
  return pcVar2 + uVar5;
}

Assistant:

static auto lex_token(LexerContext& lexer, const char* begin, const char* end, size_t begin_pos) -> const char*
{
    while(begin != end && lex_iswhite(*begin))
        ++begin, ++begin_pos;

    if(begin == end)
        return end;

    auto have_hexadecimal_prefix = [](const std::pair<const char*, size_t>& token)
    {
        return (token.second > 2 && token.first[0] == '0' && (token.first[1] == 'x' || token.first[1] == 'X'));
    };

    auto is_integer = [&have_hexadecimal_prefix](const std::pair<const char*, size_t>& token)
    {
        bool is_hexa = have_hexadecimal_prefix(token);

        for(size_t i = (is_hexa? 2 : 0); i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(is_hexa && ((token.first[i] >= 'A' && token.first[i] <= 'F')
                    || (token.first[i] >= 'a' && token.first[i] <= 'f')))
                {
                    continue;
                }
                else if(token.first[i] == '-')
                {
                    // valid even if i != 0
                    continue;
                }
                return false;
            }
        }
        return true;
    };

    auto is_float = [](const std::pair<const char*, size_t>& token)
    {
        for(size_t i = 0; i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(token.first[i] == '.' || (token.first[i] == '-' && i == 0))
                    continue;

                if(token.first[i] == 'f' || token.first[i] == 'F')
                {
                    // valid even if not in the end of the token
                    continue;
                }

                return false;
            }
        }
        return true;
    };

    if(*begin == '"')
    {
        auto it = std::find(std::next(begin), end, '"');
        if(it == end)
        {
            lexer.error(begin_pos, "missing terminating '\"' character");
            return end;
        }
        lexer.add_token(Token::String, begin_pos, std::distance(begin, it) + 1);
        return std::next(it);
    }

    if((*begin >= '0' && *begin <= '9') || *begin == '-' || *begin == '.')
    {
        auto token = lex_gettok(begin, end).value();

        if(is_integer(token))
        {
            if(lexer.program.opt.pedantic && have_hexadecimal_prefix(token))
                lexer.pedantic({begin_pos, token.second}, "hexadecimal integer literals are a language extension [-pedantic]");

            lexer.add_token(Token::Integer, begin_pos, token.second);
            return token.first + token.second;
        }
        else if(is_float(token))
        {
            lexer.add_token(Token::Float, begin_pos, token.second);
            return token.first + token.second;
        }
    }

    auto token = lex_gettok(begin, end).value();
    auto it = token.first + token.second;
    lexer.add_token(Token::Text, begin_pos, std::distance(begin, it));
    return it;
}